

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm.cpp
# Opt level: O2

int __thiscall ncnn::RMSNorm::forward_inplace(RMSNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  int j_1;
  int j_3;
  ulong uVar16;
  int j_4;
  float fVar17;
  
  iVar2 = bottom_top_blob->dims;
  if (iVar2 == 3) {
    uVar3 = bottom_top_blob->w;
    uVar9 = bottom_top_blob->h;
    uVar4 = bottom_top_blob->c;
    if (this->affine_size == uVar3) {
      uVar13 = 0;
      uVar11 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar11 = uVar13;
      }
      uVar10 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar10 = uVar13;
      }
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar13;
      }
      for (; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        iVar2 = bottom_top_blob->w;
        sVar6 = bottom_top_blob->elemsize;
        iVar5 = this->affine;
        pvVar15 = (void *)(sVar6 * bottom_top_blob->cstep * uVar13 + (long)bottom_top_blob->data);
        for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
          fVar17 = 0.0;
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            fVar1 = *(float *)((long)pvVar15 + uVar16 * 4);
            fVar17 = fVar17 + fVar1 * fVar1;
          }
          fVar17 = 1.0 / SQRT(fVar17 * (1.0 / (float)(int)uVar3) + this->eps);
          if (iVar5 == 0) {
            for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)pvVar15 + uVar16 * 4) =
                   *(float *)((long)pvVar15 + uVar16 * 4) * fVar17;
            }
          }
          else {
            pvVar7 = (this->gamma_data).data;
            for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
              *(float *)((long)pvVar15 + uVar16 * 4) =
                   *(float *)((long)pvVar15 + uVar16 * 4) * fVar17 *
                   *(float *)((long)pvVar7 + uVar16 * 4);
            }
          }
          pvVar15 = (void *)((long)pvVar15 + (long)iVar2 * sVar6);
        }
      }
    }
    else {
      uVar9 = uVar9 * uVar3;
      pvVar15 = bottom_top_blob->data;
      sVar6 = bottom_top_blob->cstep;
      iVar2 = this->affine;
      uVar13 = 0;
      uVar11 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar11 = uVar13;
      }
      uVar10 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar10 = uVar13;
      }
      sVar8 = bottom_top_blob->elemsize;
      for (; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        fVar17 = 0.0;
        for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
          fVar1 = *(float *)((long)pvVar15 + uVar14 * 4);
          fVar17 = fVar17 + fVar1 * fVar1;
        }
        fVar17 = 1.0 / SQRT(fVar17 * (1.0 / (float)(int)uVar9) + this->eps);
        if (iVar2 == 0) {
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar17
            ;
          }
        }
        else {
          pvVar7 = (this->gamma_data).data;
          for (uVar14 = 0; uVar11 != uVar14; uVar14 = uVar14 + 1) {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 *(float *)((long)pvVar15 + uVar14 * 4) * fVar17 *
                 *(float *)((long)pvVar7 + uVar14 * 4);
          }
        }
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
      }
    }
  }
  else if (iVar2 == 2) {
    uVar3 = bottom_top_blob->w;
    uVar11 = 0;
    uVar13 = 0;
    if (0 < (int)uVar3) {
      uVar13 = (ulong)uVar3;
    }
    pvVar15 = bottom_top_blob->data;
    iVar2 = this->affine;
    uVar10 = (ulong)(uint)bottom_top_blob->h;
    if (bottom_top_blob->h < 1) {
      uVar10 = uVar11;
    }
    sVar6 = bottom_top_blob->elemsize;
    for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      fVar17 = 0.0;
      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
        fVar1 = *(float *)((long)pvVar15 + uVar14 * 4);
        fVar17 = fVar17 + fVar1 * fVar1;
      }
      fVar17 = 1.0 / SQRT(fVar17 * (1.0 / (float)(int)uVar3) + this->eps);
      if (iVar2 == 0) {
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar17;
        }
      }
      else {
        pvVar7 = (this->gamma_data).data;
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          *(float *)((long)pvVar15 + uVar14 * 4) =
               *(float *)((long)pvVar15 + uVar14 * 4) * fVar17 *
               *(float *)((long)pvVar7 + uVar14 * 4);
        }
      }
      pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar3 * sVar6);
    }
  }
  else if (iVar2 == 1) {
    uVar3 = bottom_top_blob->w;
    pvVar15 = bottom_top_blob->data;
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    fVar17 = 0.0;
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      fVar1 = *(float *)((long)pvVar15 + uVar13 * 4);
      fVar17 = fVar17 + fVar1 * fVar1;
    }
    fVar17 = 1.0 / SQRT(fVar17 / (float)(int)uVar3 + this->eps);
    if (this->affine == 0) {
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        *(float *)((long)pvVar15 + uVar13 * 4) = *(float *)((long)pvVar15 + uVar13 * 4) * fVar17;
      }
    }
    else {
      pvVar7 = (this->gamma_data).data;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        *(float *)((long)pvVar15 + uVar13 * 4) =
             *(float *)((long)pvVar15 + uVar13 * 4) * fVar17 * *(float *)((long)pvVar7 + uVar13 * 4)
        ;
      }
    }
  }
  return 0;
}

Assistant:

int RMSNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = x / sqrt(rms + eps) * gamma

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sqsum += ptr[i] * ptr[i];
        }
        float rms = sqrtf(sqsum / w + eps);

        float a = 1.f / rms;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a) * gamma_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sqsum += ptr[j] * ptr[j];
            }
            float rms = sqrtf(sqsum / w + eps);

            float a = 1.f / rms;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a) * gamma_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sqsum += ptr[j] * ptr[j];
                    }
                    float rms = sqrtf(sqsum / w + eps);

                    float a = 1.f / rms;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a) * gamma_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sqsum += ptr[i] * ptr[i];
                }
                float rms = sqrtf(sqsum / size + eps);

                float a = 1.f / rms;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a) * gamma_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a;
                    }
                }
            }
        }
    }

    return 0;
}